

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall
QByteArray::toPercentEncoding(QByteArray *this,QByteArray *exclude,QByteArray *include,char percent)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  byte *pbVar5;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t __length;
  undefined8 extraout_RDX_01;
  QByteArray *in_RSI;
  char *pcVar6;
  anon_class_1_0_00000001 *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  uchar c;
  const_iterator __end1;
  const_iterator __begin1;
  QByteArray *__range1;
  qsizetype length;
  char *output;
  QByteArray *result;
  anon_class_1_0_00000001 contains;
  QByteArray *in_stack_ffffffffffffff58;
  QByteArray *in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  anon_class_1_0_00000001 *this_00;
  char *in_stack_ffffffffffffff88;
  QByteArray *in_stack_ffffffffffffff90;
  byte *local_58;
  char *local_48;
  QByteArray *local_40;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar3 = isNull((QByteArray *)0x4baa6f);
  if (bVar3) {
    QByteArray((QByteArray *)0x4baa7f);
  }
  else {
    bVar3 = isEmpty((QByteArray *)0x4baa8e);
    if (bVar3) {
      data(in_stack_ffffffffffffff60);
      QByteArray(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(qsizetype)in_RSI);
    }
    else {
      *(undefined1 **)this_00 = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)(this_00 + 8) = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)(this_00 + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_40 = (QByteArray *)0x0;
      local_48 = (char *)0x0;
      local_58 = (byte *)begin((QByteArray *)0x4bab2a);
      pbVar5 = (byte *)end(in_stack_ffffffffffffff60);
      __length = extraout_RDX;
      for (; local_58 != pbVar5; local_58 = local_58 + 1) {
        bVar1 = *local_58;
        if (((bVar1 == in_R8B) ||
            (((((bVar1 < 0x61 || (0x7a < bVar1)) && ((bVar1 < 0x41 || (0x5a < bVar1)))) &&
              ((((bVar1 < 0x30 || (0x39 < bVar1)) && (bVar1 != 0x2d)) &&
               ((bVar1 != 0x2e && (bVar1 != 0x5f)))))) &&
             ((bVar1 != 0x7e &&
              (in_stack_ffffffffffffff6f =
                    toPercentEncoding::anon_class_1_0_00000001::operator()
                              (this_00,(QByteArray *)
                                       CONCAT17(in_stack_ffffffffffffff6f,
                                                CONCAT16(in_stack_ffffffffffffff6e,
                                                         in_stack_ffffffffffffff68)),
                               (char)((ulong)in_stack_ffffffffffffff60 >> 0x38)),
              !(bool)in_stack_ffffffffffffff6f)))))) ||
           (in_stack_ffffffffffffff6e =
                 toPercentEncoding::anon_class_1_0_00000001::operator()
                           (this_00,(QByteArray *)
                                    CONCAT17(in_stack_ffffffffffffff6f,
                                             CONCAT16(in_stack_ffffffffffffff6e,
                                                      in_stack_ffffffffffffff68)),
                            (char)((ulong)in_stack_ffffffffffffff60 >> 0x38)),
           (bool)in_stack_ffffffffffffff6e)) {
          if (local_40 == (QByteArray *)0x0) {
            size(in_RSI);
            resize((QByteArray *)this_00,
                   CONCAT17(in_stack_ffffffffffffff6f,
                            CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
            in_stack_ffffffffffffff60 = (QByteArray *)data(in_stack_ffffffffffffff60);
            local_40 = in_stack_ffffffffffffff60;
          }
          local_48[(long)&local_40->d] = in_R8B;
          cVar4 = QtMiscUtils::toHexUpper((int)(bVar1 & 0xf0) >> 4);
          pcVar6 = local_48 + 2;
          (local_48 + 1)[(long)&local_40->d] = cVar4;
          cVar4 = QtMiscUtils::toHexUpper(bVar1 & 0xf);
          __length = CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),cVar4);
          local_48 = local_48 + 3;
          pcVar6[(long)&local_40->d] = cVar4;
        }
        else {
          __length = extraout_RDX_00;
          if (local_40 != (QByteArray *)0x0) {
            __length = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),bVar1);
            local_48[(long)&local_40->d] = bVar1;
          }
          local_48 = local_48 + 1;
        }
      }
      if (local_40 != (QByteArray *)0x0) {
        truncate((QByteArray *)this_00,local_48,__length);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QByteArray::toPercentEncoding(const QByteArray &exclude, const QByteArray &include,
                                         char percent) const
{
    if (isNull())
        return QByteArray();    // preserve null
    if (isEmpty())
        return QByteArray(data(), 0);

    const auto contains = [](const QByteArray &view, char c) {
        // As view.contains(c), but optimised to bypass a lot of overhead:
        return view.size() > 0 && memchr(view.data(), c, view.size()) != nullptr;
    };

    QByteArray result = *this;
    char *output = nullptr;
    qsizetype length = 0;

    for (unsigned char c : *this) {
        if (char(c) != percent
            && ((c >= 0x61 && c <= 0x7A) // ALPHA
                || (c >= 0x41 && c <= 0x5A) // ALPHA
                || (c >= 0x30 && c <= 0x39) // DIGIT
                || c == 0x2D // -
                || c == 0x2E // .
                || c == 0x5F // _
                || c == 0x7E // ~
                || contains(exclude, c))
            && !contains(include, c)) {
            if (output)
                output[length] = c;
            ++length;
        } else {
            if (!output) {
                // detach now
                result.resize(size() * 3); // worst case
                output = result.data();
            }
            output[length++] = percent;
            output[length++] = QtMiscUtils::toHexUpper((c & 0xf0) >> 4);
            output[length++] = QtMiscUtils::toHexUpper(c & 0xf);
        }
    }
    if (output)
        result.truncate(length);

    return result;
}